

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64-gen.c
# Opt level: O3

void orex(int ll,int r,int r2,int b)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = ~r & 0x30U;
  if ((~r & 0x30U) != 0) {
    uVar2 = r;
  }
  uVar3 = ~r2 & 0x30U;
  if ((~r2 & 0x30U) != 0) {
    uVar3 = r2;
  }
  if (((uVar3 | uVar2) & 8) != 0 || ll != 0) {
    uVar2 = (uVar3 >> 1 & 4 | uVar2 >> 3 & 1) + ll * 8 | 0x40;
    do {
      g(uVar2);
      bVar1 = 0xff < uVar2;
      uVar2 = uVar2 >> 8;
    } while (bVar1);
  }
  if (b != 0) {
    do {
      g(b);
      bVar1 = 0xff < (uint)b;
      b = (uint)b >> 8;
    } while (bVar1);
  }
  return;
}

Assistant:

static void orex(int ll, int r, int r2, int b) {
  if ((r & VT_VALMASK) >= VT_CONST)
    r = 0;
  if ((r2 & VT_VALMASK) >= VT_CONST)
    r2 = 0;
  if (ll || REX_BASE(r) || REX_BASE(r2))
    o(0x40 | REX_BASE(r) | (REX_BASE(r2) << 2) | (ll << 3));
  o(b);
}